

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_com_dumpparms(jpc_ms_t *ms,FILE *out)

{
  bool bVar1;
  ushort **ppuVar2;
  uint local_24;
  int printable;
  uint i;
  jpc_com_t *com;
  FILE *out_local;
  jpc_ms_t *ms_local;
  
  fprintf((FILE *)out,"regid = %lu;\n",(ms->parms).sot.tileno);
  bVar1 = true;
  local_24 = 0;
  do {
    if ((ms->parms).sot.len <= (ulong)local_24) {
LAB_0012925e:
      if (bVar1) {
        fprintf((FILE *)out,"data = ");
        fwrite((ms->parms).ppm.data,1,(ms->parms).sot.len,(FILE *)out);
        fprintf((FILE *)out,"\n");
      }
      return 0;
    }
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)(uint)(ms->parms).ppm.data[local_24]] & 0x4000) == 0) {
      bVar1 = false;
      goto LAB_0012925e;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static int jpc_com_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_com_t *com = &ms->parms.com;
	unsigned int i;
	int printable;
	fprintf(out, "regid = %"PRIuFAST16";\n", com->regid);
	printable = 1;
	for (i = 0; i < com->len; ++i) {
		if (!isprint(com->data[i])) {
			printable = 0;
			break;
		}
	}
	if (printable) {
		fprintf(out, "data = ");
		fwrite(com->data, sizeof(char), com->len, out);
		fprintf(out, "\n");
	}
	return 0;
}